

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

Convolution3DLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::Convolution3DLayerParams>
          (Arena *arena)

{
  Convolution3DLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (Convolution3DLayerParams *)operator_new(0x90);
    CoreML::Specification::Convolution3DLayerParams::Convolution3DLayerParams
              (this,(Arena *)0x0,false);
  }
  else {
    this = (Convolution3DLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x90,
                      (type_info *)&CoreML::Specification::Convolution3DLayerParams::typeinfo);
    CoreML::Specification::Convolution3DLayerParams::Convolution3DLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }